

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O0

bool COST_SENSITIVE::ec_is_example_header(example *ec)

{
  size_t sVar1;
  wclass *pwVar2;
  long in_RDI;
  v_array<COST_SENSITIVE::wclass> costs;
  v_array<COST_SENSITIVE::wclass> local_30;
  bool local_1;
  
  local_30._begin = *(wclass **)(in_RDI + 0x6828);
  local_30._end = *(wclass **)(in_RDI + 0x6830);
  local_30.end_array = *(wclass **)(in_RDI + 0x6838);
  local_30.erase_count = *(size_t *)(in_RDI + 0x6840);
  sVar1 = v_array<COST_SENSITIVE::wclass>::size(&local_30);
  if (sVar1 == 1) {
    pwVar2 = v_array<COST_SENSITIVE::wclass>::operator[](&local_30,0);
    if (pwVar2->class_index == 0) {
      pwVar2 = v_array<COST_SENSITIVE::wclass>::operator[](&local_30,0);
      if ((pwVar2->x != -3.4028235e+38) || (NAN(pwVar2->x))) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ec_is_example_header(example& ec)  // example headers look like "0:-1" or just "shared"
{
  v_array<COST_SENSITIVE::wclass> costs = ec.l.cs.costs;
  if (costs.size() != 1)
    return false;
  if (costs[0].class_index != 0)
    return false;
  if (costs[0].x != -FLT_MAX)
    return false;
  return true;
}